

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  bool bVar1;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  uint *puVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  uint *puVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  uint uVar21;
  byte bVar22;
  int *local_3c8;
  cpp_dec_float<200U,_int,_void> local_3a8;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  cpp_dec_float<200U,_int,_void> local_2b0;
  cpp_dec_float<200U,_int,_void> local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar22 = 0;
  puVar16 = (uint *)eps;
  puVar18 = local_b0;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar18 = *puVar16;
    puVar16 = puVar16 + 1;
    puVar18 = puVar18 + 1;
  }
  local_40 = (eps->m_backend).exp;
  local_3c = (eps->m_backend).neg;
  local_38._0_4_ = (eps->m_backend).fpclass;
  local_38._4_4_ = (eps->m_backend).prec_elem;
  vSolveLright(this,rhs,ridx,&rn,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_b0);
  if (forest == (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0x0) {
    if (rn < 1) {
      uVar21 = 0;
    }
    else {
      piVar5 = (this->row).perm;
      lVar9 = 0;
      uVar12 = 0;
      do {
        uVar21 = (uint)uVar12;
        iVar2 = ridx[lVar9];
        iVar7 = rhs[iVar2].m_backend.exp;
        bVar1 = rhs[iVar2].m_backend.neg;
        pcVar17 = &rhs[iVar2].m_backend;
        pcVar14 = &local_3a8;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar14->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        local_3a8.fpclass = rhs[iVar2].m_backend.fpclass;
        local_3a8.prec_elem = rhs[iVar2].m_backend.prec_elem;
        pnVar15 = eps;
        pcVar17 = &local_2b0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar17->data)._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar22 * -2 + 1) * 4);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        local_2b0.exp = (eps->m_backend).exp;
        local_2b0.neg = (eps->m_backend).neg;
        local_2b0.fpclass = (eps->m_backend).fpclass;
        local_2b0.prec_elem = (eps->m_backend).prec_elem;
        local_3a8.neg = bVar1;
        if ((bVar1 == true) &&
           (local_3a8.data._M_elems[0] != 0 || local_3a8.fpclass != cpp_dec_float_finite)) {
          local_3a8.neg = false;
        }
        local_3a8.exp = iVar7;
        if ((local_2b0.fpclass == cpp_dec_float_NaN || local_3a8.fpclass == cpp_dec_float_NaN) ||
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_3a8,&local_2b0), iVar7 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    (&rhs[iVar2].m_backend,0);
        }
        else {
          iVar2 = piVar5[iVar2];
          uVar11 = uVar21;
          if (0 < (int)uVar21) {
            do {
              uVar13 = (uint)uVar12 - 1;
              uVar8 = uVar13 >> 1;
              uVar11 = (uint)uVar12;
              if (iVar2 <= ridx[uVar8]) break;
              ridx[uVar12] = ridx[uVar8];
              uVar12 = (ulong)uVar8;
              uVar11 = uVar8;
            } while (1 < uVar13);
          }
          uVar12 = (ulong)(uVar21 + 1);
          ridx[(int)uVar11] = iVar2;
        }
        lVar9 = lVar9 + 1;
        uVar21 = (int)uVar12;
      } while (lVar9 < rn);
    }
  }
  else {
    local_2c8 = (undefined1  [16])0x0;
    local_2d8 = (undefined1  [16])0x0;
    local_2e8 = (undefined1  [16])0x0;
    local_2f8 = (undefined1  [16])0x0;
    local_308 = (undefined1  [16])0x0;
    local_318 = (undefined1  [16])0x0;
    local_328 = (undefined1  [16])0x0;
    if (rn < 1) {
      uVar21 = 0;
    }
    else {
      local_3c8 = forestIdx;
      piVar5 = (this->row).perm;
      lVar9 = 0;
      uVar21 = 0;
      do {
        iVar2 = ridx[lVar9];
        pcVar17 = &rhs[iVar2].m_backend;
        pcVar14 = pcVar17;
        puVar16 = (uint *)local_328;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          *puVar16 = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar22 * -8 + 4);
          puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
        }
        iVar7 = rhs[iVar2].m_backend.exp;
        bVar1 = rhs[iVar2].m_backend.neg;
        fVar3 = rhs[iVar2].m_backend.fpclass;
        iVar4 = rhs[iVar2].m_backend.prec_elem;
        pcVar14 = pcVar17;
        pcVar19 = &local_3a8;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar19->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar22 * -8 + 4);
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        pnVar15 = eps;
        pcVar14 = &local_230;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar14->data)._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar22 * -2 + 1) * 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        local_230.exp = (eps->m_backend).exp;
        local_230.neg = (eps->m_backend).neg;
        local_230.fpclass = (eps->m_backend).fpclass;
        local_230.prec_elem = (eps->m_backend).prec_elem;
        local_3a8.prec_elem = iVar4;
        local_3a8.fpclass = fVar3;
        local_3a8.neg = bVar1;
        if ((bVar1 == true) && (local_3a8.data._M_elems[0] != 0 || fVar3 != cpp_dec_float_finite)) {
          local_3a8.neg = false;
        }
        local_3a8.exp = iVar7;
        if ((local_230.fpclass == cpp_dec_float_NaN || fVar3 == cpp_dec_float_NaN) ||
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_3a8,&local_230), iVar6 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar17,0);
        }
        else {
          *local_3c8 = iVar2;
          iVar6 = piVar5[iVar2];
          uVar11 = uVar21;
          if (0 < (int)uVar21) {
            do {
              uVar8 = uVar11 - 1;
              uVar13 = uVar8 >> 1;
              if (iVar6 <= ridx[uVar13]) break;
              ridx[uVar11] = ridx[uVar13];
              uVar11 = uVar13;
            } while (1 < uVar8);
          }
          local_3c8 = local_3c8 + 1;
          uVar21 = uVar21 + 1;
          ridx[(int)uVar11] = iVar6;
          puVar16 = (uint *)local_328;
          pnVar15 = forest + iVar2;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar15->m_backend).data._M_elems[0] = *puVar16;
            puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
            pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar15 + ((ulong)bVar22 * -2 + 1) * 4);
          }
          forest[iVar2].m_backend.exp = iVar7;
          forest[iVar2].m_backend.neg = bVar1;
          forest[iVar2].m_backend.fpclass = fVar3;
          forest[iVar2].m_backend.prec_elem = iVar4;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < rn);
    }
    *forestNum = uVar21;
  }
  rn = uVar21;
  pnVar15 = eps;
  pnVar20 = &local_130;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar20->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
    pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar15 + ((ulong)bVar22 * -2 + 1) * 4);
    pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  local_130.m_backend.exp = (eps->m_backend).exp;
  local_130.m_backend.neg = (eps->m_backend).neg;
  local_130.m_backend.fpclass = (eps->m_backend).fpclass;
  local_130.m_backend.prec_elem = (eps->m_backend).prec_elem;
  rn = vSolveUright(this,vec,idx,rhs,ridx,rn,&local_130);
  if ((this->l).updateType == 0) {
    pnVar15 = eps;
    pnVar20 = &local_1b0;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar20->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = (eps->m_backend).exp;
    local_1b0.m_backend.neg = (eps->m_backend).neg;
    local_1b0.m_backend.fpclass = (eps->m_backend).fpclass;
    local_1b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
    rn = vSolveUpdateRight(this,vec,idx,rn,&local_1b0);
  }
  return rn;
}

Assistant:

int CLUFactor<R>::vSolveRight4update(R eps,
                                     R* vec, int* idx,                       /* result */
                                     R* rhs, int* ridx, int rn,              /* rhs    */
                                     R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright(rhs, ridx, rn, eps);
   assert(rn >= 0 && rn <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
      rn = vSolveUpdateRight(vec, idx, rn, eps);

   return rn;
}